

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::subSatUI16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  int32_t iVar2;
  ushort uVar3;
  
  iVar1 = geti32(this);
  iVar2 = geti32(other);
  uVar3 = (ushort)iVar1 - (ushort)iVar2;
  if ((ushort)iVar1 < (ushort)iVar2) {
    uVar3 = 0;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)uVar3;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::subSatUI16(const Literal& other) const {
  return Literal(sub_sat_u<uint16_t>(geti32(), other.geti32()));
}